

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
          (cmInstallDirectoryGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs,char *dest,char *file_permissions,char *dir_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,char *literal_args,bool optional)

{
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallDirectoryGenerator_00673268;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories,dirs);
  std::__cxx11::string::string((string *)&this->FilePermissions,file_permissions,&local_29);
  std::__cxx11::string::string((string *)&this->DirPermissions,dir_permissions,&local_2a);
  std::__cxx11::string::string((string *)&this->LiteralArguments,literal_args,&local_2b);
  this->Optional = optional;
  return;
}

Assistant:

cmInstallDirectoryGenerator
::cmInstallDirectoryGenerator(std::vector<std::string> const& dirs,
                              const char* dest,
                              const char* file_permissions,
                              const char* dir_permissions,
                              std::vector<std::string> const& configurations,
                              const char* component,
                              MessageLevel message,
                              const char* literal_args,
                              bool optional):
  cmInstallGenerator(dest, configurations, component, message),
  Directories(dirs),
  FilePermissions(file_permissions), DirPermissions(dir_permissions),
  LiteralArguments(literal_args), Optional(optional)
{
}